

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

econf_err setBoolValueNum(econf_file *kf,size_t num,void *v)

{
  char *string;
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *local_48;
  size_t hash;
  char *tmp;
  econf_err error;
  char *value;
  void *v_local;
  size_t num_local;
  econf_file *kf_local;
  
  local_48 = (char *)v;
  if (v == (void *)0x0) {
    local_48 = "_none_";
  }
  tmp._4_4_ = ECONF_SUCCESS;
  string = strdup(local_48);
  pcVar1 = toLowerCase(string);
  sVar2 = hashstring(pcVar1);
  if ((((*local_48 == '1') && (sVar3 = strlen(string), sVar3 == 1)) ||
      (sVar4 = hashstring("yes"), sVar2 == sVar4)) || (sVar4 = hashstring("true"), sVar2 == sVar4))
  {
    free(kf->file_entry[num].value);
    pcVar1 = strdup("true");
    kf->file_entry[num].value = pcVar1;
  }
  else if (((*local_48 == '0') && (sVar3 = strlen(string), sVar3 == 1)) ||
          ((sVar4 = hashstring("no"), sVar2 == sVar4 ||
           (sVar4 = hashstring("false"), sVar2 == sVar4)))) {
    free(kf->file_entry[num].value);
    pcVar1 = strdup("false");
    kf->file_entry[num].value = pcVar1;
  }
  else {
    sVar4 = hashstring("_none_");
    if ((sVar2 == sVar4) || (sVar3 = strlen(local_48), sVar3 == 0)) {
      free(kf->file_entry[num].value);
      pcVar1 = strdup("_none_");
      kf->file_entry[num].value = pcVar1;
    }
    else {
      tmp._4_4_ = ECONF_WRONG_BOOLEAN_VALUE;
    }
  }
  free(string);
  return tmp._4_4_;
}

Assistant:

econf_err setBoolValueNum(econf_file *kf, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : KEY_FILE_NULL_VALUE);
  econf_err error = ECONF_SUCCESS;
  char *tmp = strdup(value);
  size_t hash = hashstring(toLowerCase(tmp));

  if ((*value == '1' && strlen(tmp) == 1) || hash == YES || hash == TRUE) {
    free(kf->file_entry[num].value);
    kf->file_entry[num].value = strdup("true");
  } else if ((*value == '0' && strlen(tmp) == 1) ||
             hash == NO || hash == FALSE) {
    free(kf->file_entry[num].value);
    kf->file_entry[num].value = strdup("false");
  } else if (hash == KEY_FILE_NULL_VALUE_HASH || strlen(value) == 0) {
    free(kf->file_entry[num].value);
    kf->file_entry[num].value = strdup(KEY_FILE_NULL_VALUE);
  } else { error = ECONF_WRONG_BOOLEAN_VALUE; }

  free(tmp);
  return error;
}